

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializePayload0.cpp
# Opt level: O1

void trackerboy::deserializePayload0TU::readListIndex<trackerboy::Instrument>
               (InputBlock *block,size_t count,Table<trackerboy::Instrument> *list)

{
  Instrument *this;
  InputBlock *block_00;
  uint8_t id;
  byte local_51;
  string local_50;
  
  if (count != 0) {
    do {
      InputBlock::read<char>(block,1,(char *)&local_51);
      this = Table<trackerboy::Instrument>::insert(list,(uint)local_51);
      deserializeString_abi_cxx11_(&local_50,(deserializePayload0TU *)block,block_00);
      Named::setName(&this->super_Named,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

void readListIndex(InputBlock &block, size_t count, Table<T> &list) {
    while (count--) {
        uint8_t id;
        block.read(id);
        auto item = list.insert(id);
        item->setName(TU::deserializeString(block));
    }
}